

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispParser.cpp
# Opt level: O0

Expression * __thiscall Shell::LispParser::parse(LispParser *this)

{
  Expression *pEVar1;
  Expression *result;
  EList **in_stack_00000108;
  LispParser *in_stack_00000110;
  Tag in_stack_ffffffffffffffec;
  Expression *in_stack_fffffffffffffff0;
  
  pEVar1 = (Expression *)Expression::operator_new(0xbcc05d);
  Expression::Expression(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  parse(in_stack_00000110,in_stack_00000108);
  return pEVar1;
}

Assistant:

LispParser::Expression* LispParser::parse()
{
  Expression* result = new Expression(LIST);
  parse(&result->list);
  return result;
}